

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exper.c
# Opt level: O0

void losexp(char *drainer)

{
  boolean bVar1;
  schar sVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  int local_14;
  char *pcStack_10;
  int num;
  char *drainer_local;
  
  if ((drainer == (char *)0x0) || (iVar3 = strcmp(drainer,"#levelchange"), iVar3 != 0)) {
    bVar1 = resists_drli(&youmonst);
    pcStack_10 = drainer;
    if (bVar1 != '\0') {
      return;
    }
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  if (u.ulevel < 2) {
    if (pcStack_10 != (char *)0x0) {
      killer_format = 1;
      killer = pcStack_10;
      done(0);
    }
    u.uexp = 0;
  }
  else {
    pcVar4 = Goodbye();
    u.ulevel = u.ulevel + -1;
    pline("%s level %d.",pcVar4);
    adjabil(u.ulevel + 1,u.ulevel);
    reset_rndmonst(-1);
  }
  iVar3 = newhp();
  u.uhpmax = u.uhpmax - iVar3;
  if (u.uhpmax < 1) {
    u.uhpmax = 1;
  }
  u.uhp = u.uhp - iVar3;
  if (u.uhp < 1) {
    u.uhp = 1;
  }
  else if (u.uhpmax < u.uhp) {
    u.uhp = u.uhpmax;
  }
  if (u.ulevel < urole.xlev) {
    sVar2 = acurr(2);
    local_14 = rn2((int)sVar2 / 2 + (int)urole.enadv.lornd + (int)urace.enadv.lornd);
    local_14 = local_14 + (int)urole.enadv.lofix + (int)urace.enadv.lofix;
  }
  else {
    sVar2 = acurr(2);
    local_14 = rn2((int)sVar2 / 2 + (int)urole.enadv.hirnd + (int)urace.enadv.hirnd);
    local_14 = local_14 + (int)urole.enadv.hifix + (int)urace.enadv.hifix;
  }
  iVar3 = enermod(local_14);
  u.uenmax = u.uenmax - iVar3;
  if (u.uenmax < 0) {
    u.uenmax = 0;
  }
  u.uen = u.uen - iVar3;
  if (u.uen < 0) {
    u.uen = 0;
  }
  else if (u.uenmax < u.uen) {
    u.uen = u.uenmax;
  }
  if (0 < u.uexp) {
    lVar5 = newuexp(u.ulevel);
    u.uexp = (int)lVar5 + -1;
  }
  iflags.botl = '\x01';
  return;
}

Assistant:

void losexp(const char *drainer)		
{
	int num;

	/* override life-drain resistance when handling an explicit
	   wizard mode request to reduce level; never fatal though */
	if (drainer && !strcmp(drainer, "#levelchange"))
	    drainer = 0;
	else
	    if (resists_drli(&youmonst)) return;

	if (u.ulevel > 1) {
		pline("%s level %d.", Goodbye(), u.ulevel--);
		/* remove intrinsic abilities */
		adjabil(u.ulevel + 1, u.ulevel);
		reset_rndmonst(NON_PM);	/* new monster selection */
	} else {
		if (drainer) {
			killer_format = KILLED_BY;
			killer = drainer;
			done(DIED);
		}
		/* no drainer or lifesaved */
		u.uexp = 0;
	}
	num = newhp();
	u.uhpmax -= num;
	if (u.uhpmax < 1) u.uhpmax = 1;
	u.uhp -= num;
	if (u.uhp < 1) u.uhp = 1;
	else if (u.uhp > u.uhpmax) u.uhp = u.uhpmax;

	if (u.ulevel < urole.xlev)
	    num = rn1((int)ACURR(A_WIS)/2 + urole.enadv.lornd + urace.enadv.lornd,
			urole.enadv.lofix + urace.enadv.lofix);
	else
	    num = rn1((int)ACURR(A_WIS)/2 + urole.enadv.hirnd + urace.enadv.hirnd,
			urole.enadv.hifix + urace.enadv.hifix);
	num = enermod(num);		/* M. Stephenson */
	u.uenmax -= num;
	if (u.uenmax < 0) u.uenmax = 0;
	u.uen -= num;
	if (u.uen < 0) u.uen = 0;
	else if (u.uen > u.uenmax) u.uen = u.uenmax;

	if (u.uexp > 0)
		u.uexp = newuexp(u.ulevel) - 1;
	iflags.botl = 1;
}